

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void __thiscall juzzlin::SimpleLogger::Impl::~Impl(Impl *this)

{
  flush(this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_message);
  std::__cxx11::string::~string((string *)&this->m_tag);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&this->m_lock);
  return;
}

Assistant:

SimpleLogger::Impl::~Impl()
{
    flush();
}